

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.h
# Opt level: O0

void __thiscall cmQtAutoMocUic::SourceFileT::SourceFileT(SourceFileT *this,string *fileName)

{
  string *fileName_local;
  SourceFileT *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)fileName);
  cmFileTime::cmFileTime(&this->FileTime);
  std::shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT>::shared_ptr(&this->ParseData);
  std::__cxx11::string::string((string *)&this->BuildPath);
  this->Moc = false;
  this->Uic = false;
  return;
}

Assistant:

SourceFileT(std::string fileName)
      : FileName(std::move(fileName))
    {
    }